

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O1

void __thiscall DPolyDoor::Serialize(DPolyDoor *this,FArchive *arc)

{
  FArchive *pFVar1;
  BYTE val;
  undefined1 local_19;
  
  DMovePoly::Serialize(&this->super_DMovePoly,arc);
  pFVar1 = ::operator<<(arc,&this->m_Direction);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_TotalDist);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->m_Tics);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->m_WaitTics);
  local_19 = (undefined1)this->m_Type;
  FArchive::operator<<(pFVar1,&local_19);
  this->m_Type = (uint)(byte)local_19;
  FArchive::operator<<(pFVar1,&this->m_Close);
  return;
}

Assistant:

void DPolyDoor::Serialize (FArchive &arc)
{
	Super::Serialize (arc);
	arc << m_Direction << m_TotalDist << m_Tics << m_WaitTics << m_Type << m_Close;
}